

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

FString C_GetMassCVarString(DWORD filter,bool compact)

{
  FBaseCVar *pFVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  FString *pFVar4;
  undefined4 extraout_var_00;
  int in_EDX;
  undefined7 in_register_00000031;
  undefined4 in_register_0000003c;
  FString *this;
  FBaseCVar **ppFVar5;
  TArray<FBaseCVar_*,_FBaseCVar_*> cvars;
  
  this = (FString *)CONCAT44(in_register_0000003c,filter);
  this->Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  uVar2 = (uint)CONCAT71(in_register_00000031,compact);
  if (in_EDX == 0) {
    ppFVar5 = &CVars;
    while (pFVar1 = *ppFVar5, pFVar1 != (FBaseCVar *)0x0) {
      if ((pFVar1->Flags & 0x5000) == 0 && (pFVar1->Flags & uVar2) != 0) {
        iVar3 = (*pFVar1->_vptr_FBaseCVar[4])(pFVar1,3);
        pFVar4 = FString::operator+=(this,'\\');
        pFVar4 = FString::operator+=(pFVar4,pFVar1->Name);
        pFVar4 = FString::operator+=(pFVar4,'\\');
        FString::operator+=(pFVar4,(char *)CONCAT44(extraout_var_00,iVar3));
      }
      ppFVar5 = &pFVar1->m_Next;
    }
  }
  else {
    cvars.Array = (FBaseCVar **)0x0;
    cvars.Most = 0;
    cvars.Count = 0;
    FString::AppendFormat(this,"\\\\%ux",CONCAT71(in_register_00000031,compact) & 0xffffffff);
    FilterCompactCVars(&cvars,uVar2);
    while (cvars.Count != 0) {
      uVar2 = cvars.Count - 1;
      cvars.Count = uVar2;
      iVar3 = (*cvars.Array[uVar2]->_vptr_FBaseCVar[4])(cvars.Array[uVar2],3);
      pFVar4 = FString::operator+=(this,'\\');
      FString::operator+=(pFVar4,(char *)CONCAT44(extraout_var,iVar3));
    }
    TArray<FBaseCVar_*,_FBaseCVar_*>::~TArray(&cvars);
  }
  return (FString)(char *)this;
}

Assistant:

FString C_GetMassCVarString (DWORD filter, bool compact)
{
	FBaseCVar *cvar;
	FString dump;

	if (compact)
	{
		TArray<FBaseCVar *> cvars;
		dump.AppendFormat("\\\\%ux", filter);
		FilterCompactCVars(cvars, filter);
		while (cvars.Pop (cvar))
		{
			UCVarValue val = cvar->GetGenericRep(CVAR_String);
			dump << '\\' << val.String;
		}
	}
	else
	{
		for (cvar = CVars; cvar != NULL; cvar = cvar->m_Next)
		{
			if ((cvar->Flags & filter) && !(cvar->Flags & (CVAR_NOSAVE|CVAR_IGNORE)))
			{
				UCVarValue val = cvar->GetGenericRep(CVAR_String);
				dump << '\\' << cvar->GetName() << '\\' << val.String;
			}
		}
	}
	return dump;
}